

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O3

void QTest::setFailed(bool failed)

{
  if (setFailed(bool)::fatalFailure == '\0') {
    setFailed();
  }
  if ((failed) && (setFailed::fatalFailure == true)) {
    std::terminate();
  }
  Internal::failed = failed;
  return;
}

Assistant:

static void setFailed(bool failed)
    {
        static const bool fatalFailure = []() {
            static const char * const environmentVar = "QTEST_FATAL_FAIL";
            if (!qEnvironmentVariableIsSet(environmentVar))
                return false;

            bool ok;
            const int fatal = qEnvironmentVariableIntValue(environmentVar, &ok);
            return ok && fatal;
        }();

        if (failed && fatalFailure)
            std::terminate();
        Internal::failed = failed;
    }